

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<unsigned_short>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<unsigned_short> min,WrappedType<unsigned_short> max,float gridSize)

{
  bool bVar1;
  WrappedType<unsigned_short> WVar2;
  char *pcVar3;
  float fVar4;
  float fVar5;
  int local_c4;
  int i_1;
  int i;
  WrappedType<unsigned_short> local_9c;
  unsigned_short local_9a;
  unsigned_short local_98;
  unsigned_short local_96;
  WrappedType<unsigned_short> local_94;
  unsigned_short local_92;
  unsigned_short local_90;
  unsigned_short local_8e;
  Ushort local_8c;
  WrappedType<unsigned_short> local_8a;
  unsigned_short local_88;
  unsigned_short local_86;
  unsigned_short local_84;
  WrappedType<unsigned_short> local_82;
  unsigned_short local_80;
  unsigned_short local_7e;
  unsigned_short local_7c;
  Ushort local_7a;
  WrappedType<unsigned_short> local_78;
  unsigned_short local_76;
  unsigned_short local_74;
  unsigned_short local_72;
  WrappedType<unsigned_short> local_70;
  unsigned_short local_6e;
  int local_6c;
  WrappedType<unsigned_short> local_68;
  WrappedType<unsigned_short> local_66;
  int attemptNdx;
  WrappedType<unsigned_short> w;
  WrappedType<unsigned_short> z;
  WrappedType<unsigned_short> y2;
  WrappedType<unsigned_short> y1;
  WrappedType<unsigned_short> x2;
  WrappedType<unsigned_short> x1;
  int quadNdx;
  undefined1 local_50 [4];
  WrappedType<unsigned_short> minDiff;
  WrappedType<unsigned_short> minQuadSize;
  deRandom rnd;
  char *_data;
  char *resultData;
  int quadStride;
  int componentStride;
  float gridSize_local;
  Primitive primitive_local;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  WrappedType<unsigned_short> max_local;
  WrappedType<unsigned_short> min_local;
  
  count_local._2_2_ = min.m_value;
  count_local._0_2_ = max.m_value;
  resultData._0_4_ = 0;
  gridSize_local = (float)stride;
  if (stride == 0) {
    gridSize_local = (float)(componentCount * 2);
  }
  if (primitive == PRIMITIVE_TRIANGLES) {
    resultData._0_4_ = (int)gridSize_local * 6;
  }
  pcVar3 = (char *)operator_new__((long)(offset + (int)resultData * count));
  deRandom_init((deRandom *)local_50,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar4 = gls::GLValue::WrappedType<unsigned_short>::to<float>
                      ((WrappedType<unsigned_short> *)&count_local);
    fVar5 = gls::GLValue::WrappedType<unsigned_short>::to<float>
                      ((WrappedType<unsigned_short> *)((long)&count_local + 2));
    fVar4 = deFloatAbs(fVar4 - fVar5);
    quadNdx._2_2_ = gls::GLValue::WrappedType<unsigned_short>::fromFloat(fVar4 * gridSize);
    x1.m_value = (unsigned_short)minValue<deqp::gls::GLValue::WrappedType<unsigned_short>>();
    bVar1 = gls::GLValue::WrappedType<unsigned_short>::operator>
                      (&x1,(WrappedType<unsigned_short> *)((long)&quadNdx + 2));
    if (bVar1) {
      quadNdx._0_2_ = minValue<deqp::gls::GLValue::WrappedType<unsigned_short>>();
    }
    else {
      quadNdx._0_2_ = quadNdx._2_2_;
    }
    for (_y2 = 0; _y2 < count; _y2 = _y2 + 1) {
      for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
        local_72 = count_local._2_2_;
        local_74 = count_local._0_2_;
        local_70.m_value =
             (unsigned_short)
             getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                       ((deRandom *)local_50,count_local._2_2_,count_local._0_2_);
        local_6e = (unsigned_short)
                   roundTo<deqp::gls::GLValue::WrappedType<unsigned_short>>
                             ((WrappedType<unsigned_short> *)&quadNdx,&local_70);
        local_7a.m_value = quadNdx._0_2_;
        z.m_value = local_6e;
        local_7e = (unsigned_short)
                   gls::GLValue::WrappedType<unsigned_short>::operator-
                             ((WrappedType<unsigned_short> *)&count_local,&z);
        local_7c = (unsigned_short)
                   abs<deqp::gls::GLValue::WrappedType<unsigned_short>>((Ushort)local_7e);
        local_78.m_value =
             (unsigned_short)
             getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                       ((deRandom *)local_50,local_7a,(Ushort)local_7c);
        local_76 = (unsigned_short)
                   roundTo<deqp::gls::GLValue::WrappedType<unsigned_short>>
                             ((WrappedType<unsigned_short> *)&quadNdx,&local_78);
        local_84 = count_local._2_2_;
        local_86 = count_local._0_2_;
        w.m_value = local_76;
        local_82.m_value =
             (unsigned_short)
             getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                       ((deRandom *)local_50,count_local._2_2_,count_local._0_2_);
        local_80 = (unsigned_short)
                   roundTo<deqp::gls::GLValue::WrappedType<unsigned_short>>
                             ((WrappedType<unsigned_short> *)&quadNdx,&local_82);
        local_8c.m_value = quadNdx._0_2_;
        attemptNdx._2_2_ = (WrappedType<unsigned_short>)local_80;
        local_90 = (unsigned_short)
                   gls::GLValue::WrappedType<unsigned_short>::operator-
                             ((WrappedType<unsigned_short> *)&count_local,
                              (WrappedType<unsigned_short> *)((long)&attemptNdx + 2));
        local_8e = (unsigned_short)
                   abs<deqp::gls::GLValue::WrappedType<unsigned_short>>((Ushort)local_90);
        local_8a.m_value =
             (unsigned_short)
             getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                       ((deRandom *)local_50,local_8c,(Ushort)local_8e);
        local_88 = (unsigned_short)
                   roundTo<deqp::gls::GLValue::WrappedType<unsigned_short>>
                             ((WrappedType<unsigned_short> *)&quadNdx,&local_8a);
        attemptNdx._0_2_ = (WrappedType<unsigned_short>)local_88;
        if (componentCount < 3) {
          local_92 = (unsigned_short)gls::GLValue::WrappedType<unsigned_short>::create(0);
        }
        else {
          local_96 = count_local._2_2_;
          local_98 = count_local._0_2_;
          local_94.m_value =
               (unsigned_short)
               getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                         ((deRandom *)local_50,count_local._2_2_,count_local._0_2_);
          local_92 = (unsigned_short)
                     roundTo<deqp::gls::GLValue::WrappedType<unsigned_short>>
                               ((WrappedType<unsigned_short> *)&quadNdx,&local_94);
        }
        local_66.m_value = local_92;
        if (componentCount < 4) {
          local_9a = (unsigned_short)gls::GLValue::WrappedType<unsigned_short>::create(1);
        }
        else {
          local_9c.m_value =
               (unsigned_short)
               getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                         ((deRandom *)local_50,count_local._2_2_,count_local._0_2_);
          local_9a = (unsigned_short)
                     roundTo<deqp::gls::GLValue::WrappedType<unsigned_short>>
                               ((WrappedType<unsigned_short> *)&quadNdx,&local_9c);
        }
        local_68.m_value = local_9a;
        if (componentCount < 3) break;
        fVar4 = gls::GLValue::WrappedType<unsigned_short>::to<float>(&w);
        fVar5 = gls::GLValue::WrappedType<unsigned_short>::to<float>(&local_66);
        fVar4 = deFloatAbs(fVar4 + fVar5);
        fVar5 = gls::GLValue::WrappedType<unsigned_short>::to<float>
                          ((WrappedType<unsigned_short> *)&quadNdx);
        if (fVar5 <= fVar4) {
          fVar4 = gls::GLValue::WrappedType<unsigned_short>::to<float>
                            ((WrappedType<unsigned_short> *)&attemptNdx);
          fVar5 = gls::GLValue::WrappedType<unsigned_short>::to<float>(&local_68);
          fVar4 = deFloatAbs(fVar4 + fVar5);
          fVar5 = gls::GLValue::WrappedType<unsigned_short>::to<float>
                            ((WrappedType<unsigned_short> *)&quadNdx);
          if (fVar5 <= fVar4) break;
        }
      }
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData) + (long)offset,z);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + 2) + (long)offset,attemptNdx._2_2_);
      WVar2 = gls::GLValue::WrappedType<unsigned_short>::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local) + (long)offset,WVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local + 2) + (long)offset,
                 attemptNdx._2_2_);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 2) + (long)offset,z);
      WVar2 = gls::GLValue::WrappedType<unsigned_short>::operator+
                        ((WrappedType<unsigned_short> *)((long)&attemptNdx + 2),
                         (WrappedType<unsigned_short> *)&attemptNdx);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 2 + 2) + (long)offset
                 ,WVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 3) + (long)offset,z);
      WVar2 = gls::GLValue::WrappedType<unsigned_short>::operator+
                        ((WrappedType<unsigned_short> *)((long)&attemptNdx + 2),
                         (WrappedType<unsigned_short> *)&attemptNdx);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 3 + 2) + (long)offset
                 ,WVar2);
      WVar2 = gls::GLValue::WrappedType<unsigned_short>::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 4) + (long)offset,
                 WVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 4 + 2) + (long)offset
                 ,attemptNdx._2_2_);
      WVar2 = gls::GLValue::WrappedType<unsigned_short>::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 5) + (long)offset,
                 WVar2);
      WVar2 = gls::GLValue::WrappedType<unsigned_short>::operator+
                        ((WrappedType<unsigned_short> *)((long)&attemptNdx + 2),
                         (WrappedType<unsigned_short> *)&attemptNdx);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 5 + 2) + (long)offset
                 ,WVar2);
      if (2 < componentCount) {
        for (i_1 = 0; i_1 < 6; i_1 = i_1 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                    (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * i_1 + 4) +
                              (long)offset,local_66);
        }
      }
      if (3 < componentCount) {
        for (local_c4 = 0; local_c4 < 6; local_c4 = local_c4 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<unsigned_short>>
                    (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * local_c4 + 6) +
                              (long)offset,local_68);
        }
      }
    }
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}